

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O0

DTDrawingParameters *
initDTDrawingParameters
          (DelaunayTriangulation *delTri,bov_window_t *window,GLfloat (*linesPoints) [2],
          bov_points_t *pointsDraw,bov_points_t *activePointsDraw,bov_points_t *linesDraw,
          GLfloat (*bounds) [2],int FAST,int sleep)

{
  GLfloat (*paGVar1) [2];
  bov_points_t *pbVar2;
  char *pcVar3;
  bov_order_t *pbVar4;
  double dVar5;
  GLfloat local_80 [8];
  int local_60;
  float local_5c;
  GLsizei i;
  GLfloat theta;
  GLfloat dtheta;
  undefined4 local_4c;
  undefined4 local_48;
  float local_44;
  DTDrawingParameters *pDStack_40;
  GLfloat dy;
  DTDrawingParameters *DTDparams;
  bov_points_t *linesDraw_local;
  bov_points_t *activePointsDraw_local;
  bov_points_t *pointsDraw_local;
  GLfloat (*linesPoints_local) [2];
  bov_window_t *window_local;
  DelaunayTriangulation *delTri_local;
  
  DTDparams = (DTDrawingParameters *)linesDraw;
  linesDraw_local = activePointsDraw;
  activePointsDraw_local = pointsDraw;
  pointsDraw_local = (bov_points_t *)linesPoints;
  linesPoints_local = (GLfloat (*) [2])window;
  window_local = (bov_window_t *)delTri;
  pDStack_40 = (DTDrawingParameters *)malloc(0x6d0);
  pDStack_40->delTri = (DelaunayTriangulation *)window_local;
  pDStack_40->window = (bov_window_t *)linesPoints_local;
  pDStack_40->linesPoints = (GLfloat (*) [2])pointsDraw_local;
  pDStack_40->pointsDraw = activePointsDraw_local;
  pDStack_40->activePointsDraw = linesDraw_local;
  pDStack_40->linesDraw = (bov_points_t *)DTDparams;
  pDStack_40->FAST = FAST;
  pDStack_40->sleep = sleep;
  pDStack_40->draw_circle = 1;
  local_44 = bounds[1][1] - (*bounds)[1];
  pDStack_40->y_min = local_44 * -0.25 + (*bounds)[1];
  pDStack_40->y_max = local_44 * 0.25 + bounds[1][1];
  pDStack_40->n_divides = 0;
  pDStack_40->n_divides_max = *(int *)((long)&window_local->self + 4) >> 1;
  paGVar1 = (GLfloat (*) [2])malloc((long)pDStack_40->n_divides_max << 4);
  pDStack_40->divideLinesPoints = paGVar1;
  pbVar2 = bov_points_new(pDStack_40->divideLinesPoints,pDStack_40->n_divides_max << 1,0x88e4);
  pDStack_40->divideLinesDraw = pbVar2;
  pcVar3 = (char *)calloc((long)pDStack_40->n_divides_max,1);
  pDStack_40->divideLinesMask = pcVar3;
  theta = 1.0;
  dtheta = 0.0;
  local_4c = 0;
  local_48 = 0x3f4ccccd;
  bov_points_set_color(pDStack_40->divideLinesDraw,&theta);
  bov_points_set_width(pDStack_40->divideLinesDraw,0.002);
  i = 0x3d80adfd;
  local_5c = 0.0;
  for (local_60 = 0; local_60 < 100; local_60 = local_60 + 1) {
    dVar5 = cos((double)local_5c);
    pDStack_40->cos_[local_60] = (float)dVar5;
    dVar5 = sin((double)local_5c);
    pDStack_40->sin_[local_60] = (float)dVar5;
    local_5c = (float)i + local_5c;
  }
  pbVar2 = bov_points_new(pDStack_40->delTri->points,pDStack_40->delTri->n_points,0x88e4);
  pDStack_40->searchPointsDraw = pbVar2;
  pbVar2 = bov_points_new(pDStack_40->circ,100,0x88e4);
  pDStack_40->circlePointsDraw = pbVar2;
  pbVar4 = bov_order_new((GLuint *)pDStack_40->searchPoints,3,0x88e4);
  pDStack_40->searchPointsOrder = pbVar4;
  local_80[4] = 0.0;
  local_80[5] = 0.565;
  local_80[6] = 0.901;
  local_80[7] = 1.0;
  bov_points_set_color(pDStack_40->searchPointsDraw,local_80 + 4);
  bov_points_set_width(pDStack_40->searchPointsDraw,0.015);
  local_80[0] = 0.0;
  local_80[1] = 0.565;
  local_80[2] = 0.901;
  local_80[3] = 1.0;
  bov_points_set_color(pDStack_40->circlePointsDraw,local_80);
  bov_points_set_width(pDStack_40->circlePointsDraw,0.004);
  return pDStack_40;
}

Assistant:

DTDrawingParameters* initDTDrawingParameters(DelaunayTriangulation *delTri,
											 bov_window_t *window,
						 					 GLfloat linesPoints[][2],
						 					 bov_points_t *pointsDraw,
											 bov_points_t *activePointsDraw,
											 bov_points_t *linesDraw,
											 GLfloat bounds[][2],
						 					 int FAST, int sleep) {

	DTDrawingParameters *DTDparams = malloc(sizeof(DTDrawingParameters));
	DTDparams->delTri = delTri;
	DTDparams->window = window;
	DTDparams->linesPoints = linesPoints;
	DTDparams->pointsDraw = pointsDraw;
	DTDparams->activePointsDraw = activePointsDraw;
	DTDparams->linesDraw = linesDraw;
	DTDparams->FAST = FAST;
	DTDparams->sleep = sleep;
	DTDparams->draw_circle = 1;

	GLfloat dy = bounds[1][1] - bounds[0][1];

	DTDparams->y_min = bounds[0][1] - 0.25 * dy;
	DTDparams->y_max = bounds[1][1] + 0.25 * dy;

	DTDparams->n_divides = 0;
	DTDparams->n_divides_max = delTri->n_points >> 1;

	DTDparams->divideLinesPoints = malloc(sizeof(DTDparams->divideLinesPoints[0]) * DTDparams->n_divides_max * 2);
	DTDparams->divideLinesDraw = bov_points_new(DTDparams->divideLinesPoints, DTDparams->n_divides_max * 2, GL_STATIC_DRAW);
	DTDparams->divideLinesMask = calloc(DTDparams->n_divides_max, sizeof(char));

	bov_points_set_color(DTDparams->divideLinesDraw, DIVIDE_LINES_COLOR);
	bov_points_set_width(DTDparams->divideLinesDraw, DIVIDE_LINES_WIDTH);

	GLfloat dtheta = 2 * M_PI / (GLfloat) N_POINTS;
	GLfloat theta = 0.0;

	for (GLsizei i = 0; i < N_POINTS; i++) {
		DTDparams->cos_[i] = cos(theta);
		DTDparams->sin_[i] = sin(theta);

		theta += dtheta;
	}

	DTDparams->searchPointsDraw = bov_points_new(DTDparams->delTri->points, DTDparams->delTri->n_points, GL_STATIC_DRAW);
	DTDparams->circlePointsDraw = bov_points_new(DTDparams->circ, N_POINTS, GL_STATIC_DRAW);
	DTDparams->searchPointsOrder = bov_order_new(DTDparams->searchPoints, 3, GL_STATIC_DRAW);

	bov_points_set_color(DTDparams->searchPointsDraw, SEARCHED_POINTS_COLOR);
	bov_points_set_width(DTDparams->searchPointsDraw, SEARCHED_POINTS_WIDTH);
	bov_points_set_color(DTDparams->circlePointsDraw, CIRCLE_LINES_COLOR);
	bov_points_set_width(DTDparams->circlePointsDraw, CIRCLE_LINES_WIDTH);

	return DTDparams;
}